

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O2

char * get_apple_string(FT_Memory memory,FT_Stream stream,TT_Name entry,char_type_func char_type,
                       FT_Bool report_invalid_characters)

{
  uchar *puVar1;
  int iVar2;
  char *P;
  long lVar3;
  FT_Error error;
  int local_44;
  FT_Stream local_40;
  ulong local_38;
  
  P = (char *)ft_mem_qalloc(memory,(ulong)entry->stringLength + 1,&local_44);
  if (local_44 == 0) {
    local_44 = FT_Stream_Seek(stream,entry->stringOffset);
    if ((local_44 == 0) &&
       (local_44 = FT_Stream_EnterFrame(stream,(ulong)entry->stringLength), local_44 == 0)) {
      puVar1 = stream->cursor;
      local_38 = (ulong)entry->stringLength;
      lVar3 = 0;
      local_40 = stream;
      while( true ) {
        if ((int)local_38 == (int)lVar3) {
          P[lVar3] = '\0';
          FT_Stream_ExitFrame(local_40);
          return P;
        }
        iVar2 = (*char_type)((int)(char)puVar1[lVar3]);
        if (iVar2 == 0) break;
        P[lVar3] = puVar1[lVar3];
        lVar3 = lVar3 + 1;
      }
      FT_Stream_ExitFrame(local_40);
    }
    ft_mem_free(memory,P);
    entry->stringOffset = 0;
    entry->stringLength = 0;
    ft_mem_free(memory,entry->string);
    entry->string = (FT_Byte *)0x0;
  }
  return (char *)0x0;
}

Assistant:

static char*
  get_apple_string( FT_Memory       memory,
                    FT_Stream       stream,
                    TT_Name         entry,
                    char_type_func  char_type,
                    FT_Bool         report_invalid_characters )
  {
    FT_Error  error;

    char*       result = NULL;
    FT_String*  r;
    FT_Char*    p;
    FT_UInt     len;


    if ( FT_QALLOC( result, entry->stringLength + 1 ) )
      return NULL;

    if ( FT_STREAM_SEEK( entry->stringOffset ) ||
         FT_FRAME_ENTER( entry->stringLength ) )
      goto get_apple_string_error;

    r = (FT_String*)result;
    p = (FT_Char*)stream->cursor;

    for ( len = entry->stringLength; len > 0; len--, p++ )
    {
      if ( char_type( *p ) )
        *r++ = *p;
      else
      {
        if ( report_invalid_characters )
          FT_TRACE0(( "get_apple_string:"
                      " Character `%c' (0x%X) invalid in PS name string\n",
                      *p, *p ));
        break;
      }
    }
    if ( !len )
      *r = '\0';

    FT_FRAME_EXIT();

    if ( !len )
      return result;

  get_apple_string_error:
    FT_FREE( result );

    entry->stringOffset = 0;
    entry->stringLength = 0;
    FT_FREE( entry->string );

    return NULL;
  }